

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O0

void MARGINAL::finish(data *sm)

{
  long in_RDI;
  size_t i;
  features *this;
  
  std::
  unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
  ::~unordered_map((unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
                    *)0x385e8a);
  if ((*(byte *)(in_RDI + 0x6948) & 1) != 0) {
    std::
    unordered_map<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>_>
    ::~unordered_map((unordered_map<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>_>
                      *)0x385ea9);
  }
  for (this = (features *)0x0; this < (features *)0x100;
      this = (features *)((long)&(this->values)._begin + 1)) {
    features::delete_v(this);
  }
  return;
}

Assistant:

void finish(data& sm)
{
  sm.marginals.~unordered_map();
  if (sm.compete)
    sm.expert_state.~unordered_map();
  for (size_t i = 0; i < 256; i++) sm.temp[i].delete_v();
}